

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O2

int grad_calc(custom_function *funcpt,double *x,int N,double *dx,double eps2,double *f)

{
  double *__ptr;
  ulong uVar1;
  char *__format;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  __ptr = (double *)malloc((long)N * 8);
  uVar3 = 0;
  uVar2 = 0;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  while( true ) {
    if (uVar3 == uVar2) {
      free(__ptr);
      return 0;
    }
    dVar4 = x[uVar3];
    if (ABS(dVar4) < 1.0 / ABS(dx[uVar3])) {
      dVar4 = signx(dVar4);
      dVar4 = dVar4 / ABS(dx[uVar3]);
    }
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      __ptr[uVar1] = x[uVar1];
    }
    __ptr[uVar3] = __ptr[uVar3] + dVar4 * eps2;
    dVar5 = (*funcpt->funcpt)(__ptr,N,funcpt->params);
    dVar6 = (*funcpt->funcpt)(x,N,funcpt->params);
    dVar4 = (dVar5 - dVar6) / (dVar4 * eps2);
    f[uVar3] = dVar4;
    if (1.79769313486232e+308 <= ABS(dVar4)) break;
    uVar3 = uVar3 + 1;
    if (NAN(dVar4)) {
      __format = "Program Exiting as the function returns NaN";
LAB_0013d0ef:
      printf(__format);
      free(__ptr);
      return 0xf;
    }
  }
  __format = "Program Exiting as the function value exceeds the maximum double value";
  goto LAB_0013d0ef;
}

Assistant:

int grad_calc(custom_function *funcpt, double *x, int N, double *dx, double eps2, double *f) {
	int i, j,retval;
	double step, fd, stepmax;
	double *xi;

	fd = eps2; // square root of macheps
	retval = 0;
	xi = (double*)malloc(sizeof(double)*N);

	for (i = 0; i < N; ++i) {
		if (fabs(x[i]) >= 1.0 / fabs(dx[i])) {
			stepmax = x[i];
		}
		else {
			stepmax = signx(x[i]) * 1.0 / fabs(dx[i]);
		}
		step = fd * stepmax;
		for (j = 0; j < N; ++j) {
			xi[j] = x[j];
		}
		xi[i] += step;
		f[i] = (FUNCPT_EVAL(funcpt, xi, N) - FUNCPT_EVAL(funcpt, x, N)) / step;
		if (f[i] >= DBL_MAX || f[i] <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(xi);
			return 15;
		}
		if (f[i] != f[i]) {
			printf("Program Exiting as the function returns NaN");
			free(xi);
			return 15;
		}
		//xi[i] -= step;
	}

	free(xi);
	return retval;

}